

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(uint32_t n,Nonnull<char_*> out_str)

{
  uint uVar1;
  uint64_t uVar2;
  char *in_RSI;
  uint in_EDI;
  uint64_t bottom;
  uint32_t mod08;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  char *v;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffe0;
  uint32_t i;
  char *local_8;
  
  if (in_EDI < 10) {
    *in_RSI = (char)in_EDI + '0';
    local_8 = in_RSI + 1;
  }
  else {
    i = (uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
    if (in_EDI < 100000000) {
      v = in_RSI;
      uVar2 = anon_unknown_0::PrepareEightDigits(i);
      if (uVar2 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0xf4,
                      "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar1 = countr_zero<unsigned_long>(uVar2);
      little_endian::Store64
                ((Nonnull<void_*>)CONCAT44(in_EDI,in_stack_ffffffffffffffc0),(uint64_t)v);
      local_8 = in_RSI + (8 - (ulong)(uVar1 >> 3));
    }
    else {
      uVar1 = in_EDI % 100000000;
      uVar2 = anon_unknown_0::PrepareEightDigits(i);
      local_8 = anon_unknown_0::EncodeHundred(uVar1,(Nonnull<char_*>)(uVar2 + 0x3030303030303030));
      little_endian::Store64
                ((Nonnull<void_*>)CONCAT44(in_EDI,in_stack_ffffffffffffffc0),(uint64_t)in_RSI);
      local_8 = local_8 + 8;
    }
  }
  *local_8 = '\0';
  return local_8;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    uint32_t n, absl::Nonnull<char*> out_str) {
  out_str = EncodeFullU32(n, out_str);
  *out_str = '\0';
  return out_str;
}